

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConfigDialog.cpp
# Opt level: O2

bool __thiscall ConfigDialog::apply(ConfigDialog *this)

{
  GeneralConfigTab *this_00;
  KeyboardConfigTab *this_01;
  SoundConfigTab *pSVar1;
  bool bVar2;
  GeneralConfig *config;
  PianoInput *input;
  SoundConfig *soundConfig;
  MidiConfig *midiConfig;
  bool bVar3;
  Categories _t1;
  
  _t1.i = (this->mDirty).i;
  bVar3 = true;
  if (_t1.i != 0) {
    if ((_t1.i & 0x10) != 0) {
      this_00 = this->mGeneral;
      config = Config::general(this->mConfig);
      GeneralConfigTab::apply(this_00,config);
      _t1.i = (this->mDirty).i;
    }
    if ((_t1.i & 2) != 0) {
      ConfigTab::clean(&this->mAppearance->super_ConfigTab);
      _t1.i = (this->mDirty).i;
    }
    if ((_t1.i & 4) != 0) {
      this_01 = this->mKeyboard;
      input = Config::pianoInput(this->mConfig);
      KeyboardConfigTab::apply(this_01,input);
      _t1.i = (this->mDirty).i;
    }
    if ((_t1.i & 1) != 0) {
      pSVar1 = this->mSound;
      soundConfig = Config::sound(this->mConfig);
      SoundConfigTab::apply(pSVar1,soundConfig);
      _t1.i = (this->mDirty).i;
    }
    if ((_t1.i & 8) != 0) {
      pSVar1 = this->mSound;
      midiConfig = Config::midi(this->mConfig);
      SoundConfigTab::apply(pSVar1,midiConfig);
      _t1.i = (this->mDirty).i;
    }
    (this->mDirty).i = 0;
    applied(this,_t1);
    if ((this->mDirty).i == 0) {
      bVar2 = (bool)QDialogButtonBox::button((StandardButton)this->mButtons);
      QWidget::setEnabled(bVar2);
    }
    else {
      bVar3 = false;
    }
  }
  return bVar3;
}

Assistant:

void ConfigDialog::clean() {
    mDirty = Config::CategoryNone;
    mButtons->button(QDialogButtonBox::Apply)->setEnabled(false);
}